

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# konvert.h
# Opt level: O2

int konvert::atoi<int,unsigned_int>(char *ch)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  
  uVar4 = (ulong)(*ch == '-');
  uVar1 = (int)ch[uVar4] - 0x30;
  uVar2 = 0;
  if (uVar1 < 10) {
    piVar5 = (int *)(ch + uVar4 + 1);
    while( true ) {
      uVar2 = *piVar5 + 0xcfcfcfd0;
      if (9 < (uVar2 & 0xff)) break;
      uVar1 = (uVar2 & 0xff) + uVar1 * 10;
      uVar3 = uVar2 >> 8 & 0xff;
      if (9 < uVar3) break;
      uVar1 = uVar1 * 10 + uVar3;
      uVar3 = uVar2 >> 0x10 & 0xff;
      if ((9 < uVar3) || (uVar1 = uVar1 * 10 + uVar3, 0x9ffffff < uVar2)) break;
      piVar5 = piVar5 + 1;
      uVar1 = uVar1 * 10 + (uVar2 >> 0x18);
    }
    uVar2 = -uVar1;
    if (*ch != '-') {
      uVar2 = uVar1;
    }
  }
  return uVar2;
}

Assistant:

inline itype atoi(const char *ch){
    unsigned char cx[4];
    uint32_t *xcx  = (uint32_t *)cx;
    utype res;
    int sign = (*ch == '-') ? -1 : 1;
    if(sign<0) ch++;

    if((res = (unsigned)(*ch++ - 0x30)) >= 10) return 0;

    uint32_t *xc = (uint32_t *)ch;

    while(true){
      *xcx = (*xc++) - 0x30303030;
      if( cx[0] <= 9 ) res = res*10 + cx[0]; else return res * sign;
      if( cx[1] <= 9 ) res = res*10 + cx[1]; else return res * sign;
      if( cx[2] <= 9 ) res = res*10 + cx[2]; else return res * sign;
      if( cx[3] <= 9 ) res = res*10 + cx[3]; else return res * sign;
    }
  }